

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

uint64_t call_recip_estimate(int *exp,int exp_off,uint64_t frac)

{
  uint32_t input;
  uint uVar1;
  uint64_t uVar2;
  undefined4 local_34;
  uint64_t uStack_30;
  int result_exp;
  uint64_t result_frac;
  uint32_t estimate;
  uint32_t scaled;
  uint64_t frac_local;
  int exp_off_local;
  int *exp_local;
  
  _estimate = frac;
  if (*exp == 0) {
    uVar2 = extract64(frac,0x33,1);
    if (uVar2 == 0) {
      *exp = -1;
      _estimate = frac << 2;
    }
    else {
      _estimate = frac << 1;
    }
  }
  uVar2 = extract64(_estimate,0x2c,8);
  input = deposit32(0x100,0,8,(uint32_t)uVar2);
  uVar1 = recip_estimate(input);
  local_34 = exp_off - *exp;
  uStack_30 = deposit64(0,0x2c,8,(ulong)uVar1);
  if (local_34 == 0) {
    uStack_30 = deposit64(uStack_30 >> 1,0x33,1,1);
  }
  else if (local_34 == -1) {
    uStack_30 = deposit64(uStack_30 >> 2,0x32,2,1);
    local_34 = 0;
  }
  *exp = local_34;
  return uStack_30;
}

Assistant:

static uint64_t call_recip_estimate(int *exp, int exp_off, uint64_t frac)
{
    uint32_t scaled, estimate;
    uint64_t result_frac;
    int result_exp;

    /* Handle sub-normals */
    if (*exp == 0) {
        if (extract64(frac, 51, 1) == 0) {
            *exp = -1;
            frac <<= 2;
        } else {
            frac <<= 1;
        }
    }

    /* scaled = UInt('1':fraction<51:44>) */
    scaled = deposit32(1 << 8, 0, 8, extract64(frac, 44, 8));
    estimate = recip_estimate(scaled);

    result_exp = exp_off - *exp;
    result_frac = deposit64(0, 44, 8, estimate);
    if (result_exp == 0) {
        result_frac = deposit64(result_frac >> 1, 51, 1, 1);
    } else if (result_exp == -1) {
        result_frac = deposit64(result_frac >> 2, 50, 2, 1);
        result_exp = 0;
    }

    *exp = result_exp;

    return result_frac;
}